

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagCheckedLong
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t value)

{
  int iVar1;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t m;
  uint32_t value_local;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  local_2c = value;
  local_28 = value;
  m._2_2_ = tag;
  _value_local = dir;
  dir_local = (TIFFDirEntry *)ndir;
  ndir_local = (uint32_t *)tif;
  if ((tif->tif_flags & 0x80) != 0) {
    TIFFSwabLong(&local_2c);
  }
  iVar1 = TIFFWriteDirectoryTagData
                    ((TIFF *)ndir_local,(uint32_t *)dir_local,_value_local,m._2_2_,4,1,4,&local_2c);
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagCheckedLong(TIFF *tif, uint32_t *ndir,
                                            TIFFDirEntry *dir, uint16_t tag,
                                            uint32_t value)
{
    uint32_t m;
    assert(sizeof(uint32_t) == 4);
    m = value;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabLong(&m);
    return (
        TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_LONG, 1, 4, &m));
}